

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translation_tests.cpp
# Opt level: O3

void __thiscall
translation_tests::translation_namedparams::test_method(translation_namedparams *this)

{
  long lVar1;
  int iVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  lazy_ostream local_1b0;
  undefined1 *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined **local_168;
  undefined1 local_160;
  undefined1 *local_158;
  char **local_150;
  bilingual_str *local_148;
  undefined **local_140;
  undefined1 local_138;
  undefined1 *local_130;
  bilingual_str **local_128;
  char *local_120;
  char *local_118;
  assertion_result local_110;
  bilingual_str result;
  bilingual_str format;
  bilingual_str arg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  arg.original._M_dataplus._M_p = (pointer)&arg.original.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&arg,"original","");
  arg.translated._M_dataplus._M_p = (pointer)&arg.translated.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&arg.translated,"translated","");
  format.original._M_dataplus._M_p = (pointer)&format.original.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&format,"original [%s]","");
  format.translated._M_dataplus._M_p = (pointer)&format.translated.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&format.translated,"translated [%s]","")
  ;
  tinyformat::format<bilingual_str>(&result,&format,&arg);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/translation_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x11;
  file.m_begin = (iterator)&local_180;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_190,msg);
  local_1b0.m_empty = false;
  local_1b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1a0 = boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&result.original,"original [original]");
  local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_110.m_message.px = (element_type *)0x0;
  local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/translation_tests.cpp"
  ;
  local_118 = "";
  local_128 = &local_148;
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae148;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_170;
  local_170 = "original [original]";
  local_160 = 0;
  local_168 = &PTR__lazy_ostream_013b0dc8;
  local_158 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_148 = &result;
  boost::test_tools::tt_detail::report_assertion
            (&local_110,&local_1b0,1,2,REQUIRE,0xf6c01d,(size_t)&local_120,0x11,&local_140,
             "\"original [original]\"",&local_168);
  boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/translation_tests.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x12;
  file_00.m_begin = (iterator)&local_1c0;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1d0,
             msg_00);
  local_1b0.m_empty = false;
  local_1b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_1a0 = boost::unit_test::lazy_ostream::inst;
  local_198 = "";
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&result.translated,"translated [translated]");
  local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar2 == 0);
  local_110.m_message.px = (element_type *)0x0;
  local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/translation_tests.cpp"
  ;
  local_118 = "";
  local_138 = 0;
  local_140 = &PTR__lazy_ostream_013ae148;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_148;
  local_170 = "translated [translated]";
  local_160 = 0;
  local_168 = &PTR__lazy_ostream_013b3120;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_170;
  local_148 = (bilingual_str *)&result.translated;
  boost::test_tools::tt_detail::report_assertion
            (&local_110,&local_1b0,1,2,REQUIRE,0xf6c057,(size_t)&local_120,0x12,&local_140,
             "\"translated [translated]\"",&local_168);
  boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result.translated._M_dataplus._M_p != &result.translated.field_2) {
    operator_delete(result.translated._M_dataplus._M_p,
                    result.translated.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result.original._M_dataplus._M_p != &result.original.field_2) {
    operator_delete(result.original._M_dataplus._M_p,
                    result.original.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)format.translated._M_dataplus._M_p != &format.translated.field_2) {
    operator_delete(format.translated._M_dataplus._M_p,
                    format.translated.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)format.original._M_dataplus._M_p != &format.original.field_2) {
    operator_delete(format.original._M_dataplus._M_p,
                    format.original.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg.translated._M_dataplus._M_p != &arg.translated.field_2) {
    operator_delete(arg.translated._M_dataplus._M_p,arg.translated.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg.original._M_dataplus._M_p != &arg.original.field_2) {
    operator_delete(arg.original._M_dataplus._M_p,arg.original.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(translation_namedparams)
{
    bilingual_str arg{"original", "translated"};
    bilingual_str format{"original [%s]", "translated [%s]"};
    bilingual_str result{strprintf(format, arg)};
    BOOST_CHECK_EQUAL(result.original, "original [original]");
    BOOST_CHECK_EQUAL(result.translated, "translated [translated]");
}